

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iostats.cpp
# Opt level: O2

summary<unsigned_int> * __thiscall
foxxll::stats_data::get_write_count_summary
          (summary<unsigned_int> *__return_storage_ptr__,stats_data *this)

{
  pointer pfVar1;
  pointer ppVar2;
  undefined8 in_RAX;
  ulong uVar3;
  long lVar4;
  pointer ppVar5;
  uint uVar6;
  ulong uVar7;
  file_stats_data *f;
  pointer pfVar8;
  pointer ppVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined8 local_38;
  
  (__return_storage_ptr__->values_per_device).
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->values_per_device).
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->values_per_device).
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = in_RAX;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::reserve(&__return_storage_ptr__->values_per_device,
            ((long)(this->file_stats_data_list_).
                   super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->file_stats_data_list_).
                  super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x30);
  pfVar1 = (this->file_stats_data_list_).
           super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pfVar8 = (this->file_stats_data_list_).
                super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>
                ._M_impl.super__Vector_impl_data._M_start; pfVar8 != pfVar1; pfVar8 = pfVar8 + 1) {
    local_38 = CONCAT44(pfVar8->write_count_,pfVar8->device_id_);
    std::
    vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
    ::emplace_back<unsigned_int,unsigned_int>
              ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                *)&__return_storage_ptr__->values_per_device,(uint *)((long)&local_38 + 4),
               (uint *)&local_38);
  }
  ppVar5 = (__return_storage_ptr__->values_per_device).
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (__return_storage_ptr__->values_per_device).
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar5 != ppVar2) {
    uVar3 = (long)ppVar2 - (long)ppVar5 >> 3;
    lVar4 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,unsigned_int>*,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<foxxll::stats_data::summary<unsigned_int>::summary<foxxll::stats_data::get_write_count_summary()const::__0>(std::vector<foxxll::file_stats_data,std::allocator<foxxll::file_stats_data>>const&,foxxll::stats_data::get_write_count_summary()const::__0_const&)::_lambda(std::pair<unsigned_int,unsigned_int>,std::pair<unsigned_int,unsigned_int>)_1_>>
              (ppVar5,ppVar2,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)ppVar2 - (long)ppVar5 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,unsigned_int>*,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<foxxll::stats_data::summary<unsigned_int>::summary<foxxll::stats_data::get_write_count_summary()const::__0>(std::vector<foxxll::file_stats_data,std::allocator<foxxll::file_stats_data>>const&,foxxll::stats_data::get_write_count_summary()const::__0_const&)::_lambda(std::pair<unsigned_int,unsigned_int>,std::pair<unsigned_int,unsigned_int>)_1_>>
                (ppVar5,ppVar2);
    }
    else {
      ppVar9 = ppVar5 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,unsigned_int>*,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<foxxll::stats_data::summary<unsigned_int>::summary<foxxll::stats_data::get_write_count_summary()const::__0>(std::vector<foxxll::file_stats_data,std::allocator<foxxll::file_stats_data>>const&,foxxll::stats_data::get_write_count_summary()const::__0_const&)::_lambda(std::pair<unsigned_int,unsigned_int>,std::pair<unsigned_int,unsigned_int>)_1_>>
                (ppVar5,ppVar9);
      for (; ppVar9 != ppVar2; ppVar9 = ppVar9 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,unsigned_int>*,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>,__gnu_cxx::__ops::_Val_comp_iter<foxxll::stats_data::summary<unsigned_int>::summary<foxxll::stats_data::get_write_count_summary()const::__0>(std::vector<foxxll::file_stats_data,std::allocator<foxxll::file_stats_data>>const&,foxxll::stats_data::get_write_count_summary()const::__0_const&)::_lambda(std::pair<unsigned_int,unsigned_int>,std::pair<unsigned_int,unsigned_int>)_1_>>
                  (ppVar9);
      }
    }
  }
  ppVar5 = (__return_storage_ptr__->values_per_device).
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (__return_storage_ptr__->values_per_device).
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)ppVar2 - (long)ppVar5;
  if ((long)ppVar2 - (long)ppVar5 == 0) {
    __return_storage_ptr__->max = 0;
    __return_storage_ptr__->total = 0;
    __return_storage_ptr__->min = 0;
    __return_storage_ptr__->average = 0.0;
    __return_storage_ptr__->median = 0.0;
  }
  else {
    uVar3 = lVar4 >> 3;
    __return_storage_ptr__->min = ppVar5->first;
    __return_storage_ptr__->max = ppVar2[-1].first;
    uVar7 = uVar3 >> 1;
    if (((long)ppVar2 - (long)ppVar5 & 8U) == 0) {
      dVar10 = (double)(ppVar5[uVar7].first + ppVar5[uVar7 - 1].first) * 0.5;
    }
    else {
      dVar10 = (double)ppVar5[uVar7].first;
    }
    __return_storage_ptr__->median = dVar10;
    uVar6 = 0;
    for (; ppVar5 != ppVar2; ppVar5 = ppVar5 + 1) {
      uVar6 = uVar6 + ppVar5->first;
    }
    auVar11._8_4_ = (int)(lVar4 >> 0x23);
    auVar11._0_8_ = uVar3;
    auVar11._12_4_ = 0x45300000;
    __return_storage_ptr__->total = uVar6;
    __return_storage_ptr__->average =
         (double)uVar6 /
         ((auVar11._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0));
  }
  return __return_storage_ptr__;
}

Assistant:

stats_data::summary<unsigned> stats_data::get_write_count_summary() const
{
    return {
               file_stats_data_list_, [](const file_stats_data& fsd) {
                   return fsd.get_write_count();
               }
    };
}